

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O1

void __thiscall uv::AcceptClient::Close(AcceptClient *this)

{
  undefined8 *puVar1;
  TcpClientCtx *pTVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ILog4zManager *pIVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long *in_FS_OFFSET;
  
  if (this->isclosed_ != false) {
    return;
  }
  pTVar2 = this->client_handle_;
  (pTVar2->tcphandle).data = this;
  uv_close(pTVar2,AfterClientClose);
  lVar3 = *in_FS_OFFSET;
  puVar1 = (undefined8 *)(lVar3 + -0x800);
  *puVar1 = 0x28746e65696c63;
  pcVar10 = (char *)(lVar3 + -0x7f9);
  uVar5 = snprintf(pcVar10,0x7f9,"%016llx",this);
  uVar4 = 0;
  if ((int)uVar5 < 0) {
LAB_00118163:
    uVar5 = uVar4;
    *pcVar10 = '\0';
  }
  else if (0x7f8 < (int)uVar5) {
    pcVar10 = (char *)(lVar3 + -1);
    uVar4 = 0x7f9;
    goto LAB_00118163;
  }
  uVar11 = (ulong)(uVar5 + 7);
  if (uVar5 < 0x7f9) {
    pcVar10 = (char *)((long)puVar1 + uVar11);
    iVar9 = 0x800 - (uVar5 + 7);
    iVar6 = snprintf(pcVar10,(long)iVar9,"%s",")close");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_001181b1:
      *pcVar10 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar9 <= iVar6) {
        pcVar10 = (char *)(lVar3 + -1);
        iVar7 = iVar9;
        goto LAB_001181b1;
      }
    }
    uVar11 = uVar11 + (long)iVar7;
  }
  if ((long)uVar11 < 0x800) {
    pcVar10 = (char *)((long)puVar1 + uVar11);
    iVar9 = 0x800 - (int)uVar11;
    iVar6 = snprintf(pcVar10,(long)iVar9,"%s"," ( ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118202:
      *pcVar10 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar9 <= iVar6) {
        pcVar10 = (char *)(lVar3 + -1);
        iVar7 = iVar9;
        goto LAB_00118202;
      }
    }
    uVar11 = uVar11 + (long)iVar7;
  }
  if ((long)uVar11 < 0x800) {
    pcVar10 = (char *)((long)puVar1 + uVar11);
    iVar9 = 0x800 - (int)uVar11;
    iVar6 = snprintf(pcVar10,(long)iVar9,"%s"," ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118253:
      *pcVar10 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar9 <= iVar6) {
        pcVar10 = (char *)(lVar3 + -1);
        iVar7 = iVar9;
        goto LAB_00118253;
      }
    }
    uVar11 = uVar11 + (long)iVar7;
  }
  if ((long)uVar11 < 0x800) {
    pcVar10 = (char *)((long)puVar1 + uVar11);
    iVar9 = 0x800 - (int)uVar11;
    iVar6 = snprintf(pcVar10,(long)iVar9,"%s"," ) : ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_001182a4:
      *pcVar10 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar9 <= iVar6) {
        pcVar10 = (char *)(lVar3 + -1);
        iVar7 = iVar9;
        goto LAB_001182a4;
      }
    }
    uVar11 = uVar11 + (long)iVar7;
  }
  if ((long)uVar11 < 0x800) {
    pcVar10 = (char *)((long)puVar1 + uVar11);
    iVar6 = 0x800 - (int)uVar11;
    iVar7 = snprintf(pcVar10,(long)iVar6,"%d",0x218);
    if (-1 < iVar7) {
      if (iVar7 < iVar6) goto LAB_001182f5;
      pcVar10 = (char *)(lVar3 + -1);
    }
    *pcVar10 = '\0';
  }
LAB_001182f5:
  pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,1,puVar1,pIVar8->_vptr_ILog4zManager[8]);
  return;
}

Assistant:

void AcceptClient::Close()
{
    if (isclosed_) {
        return;
    }
    client_handle_->tcphandle.data = this;
    //send close command
    uv_close((uv_handle_t*)&client_handle_->tcphandle, AfterClientClose);
    LOGI("client(" << this << ")close");
}